

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDFacePtr ON_SubDFace::FromVertices(ON_SubDVertex **vertex_list,size_t vertex_count)

{
  ON_SubDVertex *pOVar1;
  ON_SubDVertex *pOVar2;
  uint uVar3;
  uint uVar4;
  ON_SubDFace *this;
  ON_SubDVertex *pOVar5;
  ON_SubDVertex *pOVar6;
  ON_SubDFace ***local_d0;
  uint local_c0;
  uint local_bc;
  uint fvi_1;
  uint fvi;
  ON__UINT_PTR dir;
  uint local_a8;
  uint fvi0;
  uint i;
  uint c;
  ON_SubDFace *ef;
  ON_SubDEdgePtr OStack_90;
  unsigned_short efi;
  ON_SubDEdge *local_88;
  ON_SubDEdge *e;
  ON_SubDVertex *pOStack_78;
  uint fei;
  ON_SubDVertex *v [2];
  ON_SubDFace *pOStack_60;
  uint unsigned_vertex_count;
  ON_SubDFace *f;
  ON_SubDFace ***pppOStack_50;
  uint candidate_count;
  ON_SubDFace **candidates;
  ON_SubDFace *candiates4 [4];
  size_t vertex_count_local;
  ON_SubDVertex **vertex_list_local;
  
  if (((vertex_list == (ON_SubDVertex **)0x0) || (vertex_count < 3)) || (0xfff0 < vertex_count)) {
    vertex_list_local = (ON_SubDVertex **)0;
  }
  else {
    pppOStack_50 = (ON_SubDFace ***)0x0;
    f._4_4_ = 0;
    pOStack_60 = (ON_SubDFace *)0x0;
    v[1]._4_4_ = (uint)vertex_count;
    if (v[1]._4_4_ < 3) {
      vertex_list_local = (ON_SubDVertex **)0;
    }
    else {
      pOStack_78 = (ON_SubDVertex *)0x0;
      v[0] = *vertex_list;
      for (e._4_4_ = 0; pOVar1 = v[0], e._4_4_ < v[1]._4_4_; e._4_4_ = e._4_4_ + 1) {
        pOStack_78 = v[0];
        v[0] = vertex_list[(ulong)(e._4_4_ + 1) % (ulong)v[1]._4_4_];
        OStack_90 = ON_SubDEdge::FromVertices(pOVar1,v[0]);
        local_88 = ON_SubDEdgePtr::Edge(&stack0xffffffffffffff70);
        if ((local_88 == (ON_SubDEdge *)0x0) || (local_88->m_face_count == 0)) {
          f._4_4_ = 0;
        }
        else if (e._4_4_ == 0) {
          if (local_88->m_face_count < 5) {
            local_d0 = &candidates;
          }
          else {
            local_d0 = (ON_SubDFace ***)onmalloc((ulong)local_88->m_face_count << 3);
          }
          pppOStack_50 = local_d0;
          for (ef._6_2_ = 0; ef._6_2_ < local_88->m_face_count; ef._6_2_ = ef._6_2_ + 1) {
            this = ON_SubDEdge::Face(local_88,(uint)ef._6_2_);
            uVar4 = v[1]._4_4_;
            if ((this != (ON_SubDFace *)0x0) && (uVar3 = EdgeCount(this), uVar4 == uVar3)) {
              local_d0[f._4_4_] = (ON_SubDFace **)this;
              f._4_4_ = f._4_4_ + 1;
            }
          }
        }
        else {
          fvi0 = 0;
          for (local_a8 = 0; local_a8 < f._4_4_; local_a8 = local_a8 + 1) {
            uVar4 = ON_SubDEdge::FaceArrayIndex(local_88,(ON_SubDFace *)pppOStack_50[local_a8]);
            if (uVar4 != 0xffffffff) {
              pppOStack_50[fvi0] = pppOStack_50[local_a8];
              fvi0 = fvi0 + 1;
            }
          }
          f._4_4_ = fvi0;
        }
        if (f._4_4_ == 0) break;
        if (f._4_4_ == 1) {
          pOStack_60 = (ON_SubDFace *)*pppOStack_50;
          break;
        }
      }
      if ((pppOStack_50 != (ON_SubDFace ***)0x0) && (pppOStack_50 != &candidates)) {
        onfree(pppOStack_50);
      }
      if (pOStack_60 == (ON_SubDFace *)0x0) {
        vertex_list_local = (ON_SubDVertex **)0;
      }
      else {
        uVar4 = VertexIndex(pOStack_60,*vertex_list);
        if (uVar4 < v[1]._4_4_) {
          pOVar1 = vertex_list[1];
          pOVar5 = Vertex(pOStack_60,(uVar4 + 1) % v[1]._4_4_);
          if ((long)(int)(uint)(pOVar1 != pOVar5) == 0) {
            for (local_bc = 2; local_bc < v[1]._4_4_; local_bc = local_bc + 1) {
              pOVar2 = vertex_list[local_bc];
              pOVar6 = Vertex(pOStack_60,(uVar4 + local_bc) % v[1]._4_4_);
              if (pOVar2 != pOVar6) {
                return (ON_SubDFacePtr)0;
              }
            }
          }
          else {
            for (local_c0 = 1; local_c0 < v[1]._4_4_; local_c0 = local_c0 + 1) {
              pOVar2 = vertex_list[local_c0];
              pOVar6 = Vertex(pOStack_60,((uVar4 + v[1]._4_4_) - local_c0) % v[1]._4_4_);
              if (pOVar2 != pOVar6) {
                return (ON_SubDFacePtr)0;
              }
            }
          }
          vertex_list_local =
               (ON_SubDVertex **)
               ON_SubDFacePtr::Create(pOStack_60,(long)(int)(uint)(pOVar1 != pOVar5));
        }
        else {
          vertex_list_local = (ON_SubDVertex **)0;
        }
      }
    }
  }
  return (ON_SubDFacePtr)(ON__UINT_PTR)vertex_list_local;
}

Assistant:

const ON_SubDFacePtr ON_SubDFace::FromVertices(const ON_SubDVertex* const* vertex_list, size_t vertex_count)
{
  if (nullptr == vertex_list || vertex_count < 3 || vertex_count > ON_SubDFace::MaximumEdgeCount)
    return ON_SubDFacePtr::Null;

  const ON_SubDFace* candiates4[4];
  const ON_SubDFace** candidates = nullptr;
  unsigned candidate_count = 0;
  const ON_SubDFace* f = nullptr;

  const unsigned unsigned_vertex_count = (unsigned)vertex_count;
  if (unsigned_vertex_count < 3)
    return ON_SubDFacePtr::Null;
  const ON_SubDVertex* v[2] = { nullptr,vertex_list[0] };
  for (unsigned fei = 0; fei < unsigned_vertex_count; ++fei)
  {
    v[0] = v[1];
    v[1] = vertex_list[(fei + 1) % unsigned_vertex_count];
    const ON_SubDEdge* e = ON_SubDEdge::FromVertices(v[0], v[1]).Edge();
    if (nullptr == e || e->m_face_count <= 0)
      candidate_count = 0;
    else if (0 == fei)
    {
      candidates = (e->m_face_count <= 4) ? candiates4 : ((const ON_SubDFace**)onmalloc(e->m_face_count * sizeof(candidates[0])));
      for (unsigned short efi = 0; efi < e->m_face_count; ++efi)
      {
        const ON_SubDFace* ef = e->Face(efi);
        if (nullptr != ef && unsigned_vertex_count == ef->EdgeCount())
          candidates[candidate_count++] = ef;
      }
    }
    else
    {
      unsigned c = 0;
      for (unsigned i = 0; i < candidate_count; ++i)
      {
        if (e->FaceArrayIndex(candidates[i]) < ON_UNSET_UINT_INDEX)
          candidates[c++] = candidates[i];
      }
      candidate_count = c;
    }

    if (0 == candidate_count)
      break;
    if (1 == candidate_count)
    {
      f = candidates[0];
      break;
    }
  }

  if (nullptr != candidates && candidates != candiates4)
    onfree(candidates);

  if (nullptr == f)
    return ON_SubDFacePtr::Null;

  const unsigned fvi0 = f->VertexIndex(vertex_list[0]);
  if (fvi0 >= unsigned_vertex_count)
    return ON_SubDFacePtr::Null;

  const ON__UINT_PTR dir = (vertex_list[1] == f->Vertex((fvi0 + 1) % unsigned_vertex_count)) ? 0 : 1;
  if (0 == dir)
  {
    for (unsigned fvi = 2; fvi < unsigned_vertex_count; fvi++)
    {
      if (vertex_list[fvi] != f->Vertex((fvi0 + fvi) % unsigned_vertex_count))
        return ON_SubDFacePtr::Null;
    }
  }
  else
  {
    for (unsigned fvi = 1; fvi < unsigned_vertex_count; fvi++)
    {
      if (vertex_list[fvi] != f->Vertex((fvi0 + unsigned_vertex_count - fvi) % unsigned_vertex_count))
        return ON_SubDFacePtr::Null;
    }
  }
  return ON_SubDFacePtr::Create(f, dir);
}